

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

void Abc_GraphBuildFrontier
               (int nSize,Vec_Int_t *vEdges,Vec_Int_t *vLife,Vec_Wec_t *vFronts,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Wec_t *vNodes;
  Vec_Int_t *vVec;
  Vec_Int_t *vVec_00;
  int *pFront;
  Vec_Int_t *p;
  Vec_Int_t *pVVar5;
  Hsh_VecMan_t *pHVar6;
  abctime aVar7;
  ulong uVar8;
  int iVar9;
  int x;
  int i;
  ulong uVar10;
  size_t __nmemb;
  uint nCap;
  ulong uVar11;
  uint i_00;
  Hsh_VecMan_t *local_a0;
  Hsh_VecMan_t *local_98;
  
  aVar4 = Abc_Clock();
  nCap = vEdges->nSize / 2;
  iVar9 = vLife->nSize / 2;
  vNodes = Vec_WecAlloc(nCap);
  vVec = Vec_IntAlloc(iVar9);
  vVec_00 = Vec_IntAlloc(nCap);
  __nmemb = (size_t)iVar9;
  pFront = (int *)calloc(__nmemb,4);
  iVar9 = (int)__nmemb;
  local_a0 = Hsh_VecManStart(iVar9);
  local_98 = Hsh_VecManStart(iVar9);
  Hsh_VecManAdd(local_a0,vVec);
  uVar1 = nCap - 1;
  if ((int)nCap < 1) {
    nCap = 0;
  }
  for (i_00 = 0; i_00 != nCap; i_00 = i_00 + 1) {
    p = Vec_WecPushLevel(vNodes);
    iVar9 = local_a0->vMap->nSize;
    Vec_IntPush(vVec_00,iVar9);
    if (fVerbose != 0) {
      putchar(10);
      uVar2 = Vec_IntEntry(vEdges,i_00 * 2);
      uVar3 = Vec_IntEntry(vEdges,i_00 * 2 + 1);
      printf("Processing edge %d = {%d %d}\n",(ulong)i_00,(ulong)uVar2,(ulong)uVar3);
      printf("Frontier: ");
      pVVar5 = Vec_WecEntry(vFronts,i_00);
      Vec_IntPrint(pVVar5);
      putchar(10);
    }
    i = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    for (; i != iVar9; i = i + 1) {
      pVVar5 = Hsh_VecReadEntry(local_a0,i);
      for (x = 0; x != 2; x = x + 1) {
        uVar2 = Abc_GraphBuildState(pVVar5,i_00,x,vEdges,vLife,vFronts,pFront,vVec,fVerbose);
        uVar11 = (ulong)uVar2;
        if (uVar2 == 1) {
          uVar11 = 0xfffffffe;
        }
        if (uVar2 == 1 && i_00 != uVar1) {
          uVar2 = Hsh_VecManAdd(local_98,vVec);
          uVar11 = (ulong)uVar2;
        }
        if (fVerbose != 0) {
          printf("Return value = %d\n",uVar11);
        }
        Vec_IntPush(p,(int)uVar11);
      }
    }
    Hsh_VecManStop(local_a0);
    pHVar6 = Hsh_VecManStart((int)local_a0);
    local_a0 = local_98;
    local_98 = pHVar6;
  }
  Abc_GraphCountPaths(vNodes,vEdges);
  uVar8 = 0;
  uVar11 = (ulong)(uint)vVec_00->nSize;
  if (vVec_00->nSize < 1) {
    uVar11 = uVar8;
  }
  uVar10 = 0;
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    uVar10 = (ulong)(uint)((int)uVar10 + vVec_00->pArray[uVar8]);
  }
  iVar9 = 0x7f8ea5;
  printf("States = %8d   Paths = %24.0f  ",uVar10);
  aVar7 = Abc_Clock();
  Abc_Print(iVar9,"%s =","Time");
  Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar7 - aVar4) / 1000000.0);
  if (fVerbose != 0) {
    Vec_IntPrint(vVec_00);
  }
  Abc_GraphDeriveGiaDump(vNodes,vEdges,nSize);
  free(pFront);
  Vec_WecFree(vNodes);
  Vec_IntFree(vVec);
  Vec_IntFree(vVec_00);
  Hsh_VecManStop(local_a0);
  Hsh_VecManStop(local_98);
  return;
}

Assistant:

void Abc_GraphBuildFrontier( int nSize, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int fVerbose )
{
    abctime clk = Abc_Clock();
    double nPaths;
    int nEdges = Vec_IntSize(vEdges)/2;
    int nNodes = Vec_IntSize(vLife)/2;
    Vec_Wec_t * vNodes = Vec_WecAlloc( nEdges );
    Vec_Int_t * vStateNew = Vec_IntAlloc( nNodes );
    Vec_Int_t * vStateCount = Vec_IntAlloc( nEdges );
    int e, s, x, Next, * pFront = ABC_CALLOC( int, nNodes );
    Hsh_VecMan_t * pThis = Hsh_VecManStart( 1000 );
    Hsh_VecMan_t * pNext = Hsh_VecManStart( 1000 );
    Hsh_VecManAdd( pThis, vStateNew );
    for ( e = 0; e < nEdges; e++ )
    {
        Vec_Int_t * vNode = Vec_WecPushLevel(vNodes);
        int nStates = Hsh_VecSize( pThis );
        Vec_IntPush( vStateCount, nStates );
        if ( fVerbose )
        {
            printf( "\n" );
            printf( "Processing edge %d = {%d %d}\n", e, Vec_IntEntry(vEdges, 2*e), Vec_IntEntry(vEdges, 2*e+1) );
            printf( "Frontier: " );  Vec_IntPrint( Vec_WecEntry(vFronts, e) );
            printf( "\n" );
        }
        for ( s = 0; s < nStates; s++ )
        {
            Vec_Int_t * vState = Hsh_VecReadEntry(pThis, s);
            for ( x = 0; x < 2; x++ )
            {
                Next = Abc_GraphBuildState(vState, e, x, vEdges, vLife, vFronts, pFront, vStateNew, fVerbose);
                if ( Next == 1 )
                {
                    if ( e == nEdges - 1 ) // last edge
                        Next = -2; // const1
                    else
                        Next = Hsh_VecManAdd( pNext, vStateNew );
                }
                if ( fVerbose ) printf( "Return value = %d\n", Next );
                Vec_IntPush( vNode, Next );
            }
        }
        Hsh_VecManStop( pThis );
        pThis = pNext;
        pNext = Hsh_VecManStart( 1000 );
    }
    nPaths = Abc_GraphCountPaths(vNodes, vEdges);
    printf( "States = %8d   Paths = %24.0f  ", Vec_IntSum(vStateCount), nPaths ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
        Vec_IntPrint( vStateCount );
    Abc_GraphDeriveGiaDump( vNodes, vEdges, nSize );
    ABC_FREE( pFront );
    Vec_WecFree( vNodes );
    Vec_IntFree( vStateNew );
    Vec_IntFree( vStateCount );
    Hsh_VecManStop( pThis );
    Hsh_VecManStop( pNext );
}